

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

void FT_Raccess_Guess(FT_Library library,FT_Stream stream,char *base_name,char **new_names,
                     FT_Long *offsets,FT_Error *errors)

{
  FT_Error FVar1;
  long lVar2;
  FT_Error *pFVar3;
  long lVar4;
  FT_Error *pFVar5;
  
  lVar2 = 0;
  lVar4 = 0;
  pFVar5 = errors;
  do {
    if (lVar2 == 0x90) {
      return;
    }
    *new_names = (char *)0x0;
    if (stream == (FT_Stream)0x0) {
      *pFVar5 = 0;
      pFVar3 = pFVar5;
LAB_001373c5:
      FVar1 = (**(code **)((long)&ft_raccess_guess_table[0].func + lVar2))
                        (library,stream,base_name,new_names,offsets);
      *pFVar3 = FVar1;
    }
    else {
      FVar1 = FT_Stream_Seek(stream,0);
      *pFVar5 = FVar1;
      if (FVar1 == 0) {
        pFVar3 = errors + lVar4;
        goto LAB_001373c5;
      }
    }
    lVar4 = lVar4 + 1;
    pFVar5 = pFVar5 + 1;
    lVar2 = lVar2 + 0x10;
    offsets = offsets + 1;
    new_names = new_names + 1;
  } while( true );
}

Assistant:

FT_BASE_DEF( void )
  FT_Raccess_Guess( FT_Library  library,
                    FT_Stream   stream,
                    char*       base_name,
                    char      **new_names,
                    FT_Long    *offsets,
                    FT_Error   *errors )
  {
    FT_Int  i;


    for ( i = 0; i < FT_RACCESS_N_RULES; i++ )
    {
      new_names[i] = NULL;
      if ( NULL != stream )
        errors[i] = FT_Stream_Seek( stream, 0 );
      else
        errors[i] = FT_Err_Ok;

      if ( errors[i] )
        continue;

      errors[i] = (FT_RACCESS_GUESS_TABLE_GET[i].func)( library,
                                                 stream, base_name,
                                                 &(new_names[i]),
                                                 &(offsets[i]) );
    }

    return;
  }